

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpn.c
# Opt level: O1

void Abc_TruthNpnPerform(Abc_TtStore_t *p,int NpnType,int fVerbose)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  permInfo *pi;
  Abc_TtHieMan_t *p_00;
  char *pcVar4;
  long lVar5;
  word *pTruth;
  char *pcVar6;
  code *func;
  int flag;
  ulong uVar7;
  char pCanonPerm [16];
  timespec ts_1;
  uint pAux [2048];
  word pAuxWord1 [1024];
  char acStack_4068 [24];
  long local_4050;
  timespec local_4048;
  timespec local_4038 [512];
  word local_2038 [1025];
  
  iVar2 = clock_gettime(3,local_4038);
  if (iVar2 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_4038[0].tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_4038[0].tv_sec * -1000000;
  }
  if (NpnType == 0) {
    pcVar6 = "uniqifying          ";
    goto LAB_002e787b;
  }
  switch(NpnType) {
  case 1:
    pcVar6 = "exact NPN           ";
    break;
  case 2:
    pcVar6 = "counting 1s         ";
    break;
  case 3:
    pcVar6 = "Jake\'s hybrid fast  ";
    break;
  case 4:
    pcVar6 = "Jake\'s hybrid good  ";
    break;
  case 5:
    pcVar6 = "new hybrid fast     ";
    break;
  case 6:
    pcVar6 = "new phase flipping  ";
    break;
  case 7:
    pcVar6 = "new hier. matching  ";
    break;
  case 8:
    pcVar6 = "new adap. matching  ";
    break;
  case 9:
    pcVar6 = "adjustable algorithm (heuristic) ";
    break;
  case 10:
    pcVar6 = "adjustable algorithm (exact)     ";
    break;
  case 0xb:
    pcVar6 = "new cost-aware exact algorithm   ";
    break;
  default:
    bVar1 = true;
    pcVar6 = (char *)0x0;
    goto LAB_002e787d;
  }
LAB_002e787b:
  bVar1 = false;
LAB_002e787d:
  if (0x10 < p->nVars) {
    __assert_fail("p->nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcNpn.c"
                  ,0xd4,"void Abc_TruthNpnPerform(Abc_TtStore_t *, int, int)");
  }
  if (!bVar1) {
    pcVar4 = "s";
    if (p->nFuncs == 1) {
      pcVar4 = "";
    }
    printf("Applying %-20s to %8d func%s of %2d vars...  ",pcVar6,(ulong)(uint)p->nFuncs,pcVar4);
  }
  if (fVerbose != 0) {
    putchar(10);
  }
  local_4050 = lVar5;
  if (NpnType == 0) {
    if (0 < p->nFuncs) {
      uVar7 = 0;
      do {
        if (fVerbose != 0) {
          printf("%7d : ",uVar7 & 0xffffffff);
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
          putchar(10);
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)p->nFuncs);
    }
    goto LAB_002e7ed2;
  }
  switch(NpnType) {
  case 1:
    Abc_TruthNpnCountUnique(p);
    pi = setPermInfoPtr(p->nVars);
    if (0 < p->nFuncs) {
      uVar7 = 0;
      do {
        if (fVerbose == 0) {
          simpleMinimal(p->pFuncs[uVar7],(word *)local_4038,local_2038,pi,p->nVars);
        }
        else {
          printf("%7d : ",uVar7 & 0xffffffff);
          simpleMinimal(p->pFuncs[uVar7],(word *)local_4038,local_2038,pi,p->nVars);
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
          Abc_TruthNpnPrint(acStack_4068,0,p->nVars);
          putchar(10);
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)p->nFuncs);
    }
    freePermInfoPtr(pi);
    break;
  case 2:
    if (0 < p->nFuncs) {
      uVar7 = 0;
      do {
        if (fVerbose != 0) {
          printf("%7d : ",uVar7 & 0xffffffff);
        }
        resetPCanonPermArray(acStack_4068,p->nVars);
        uVar3 = Kit_TruthSemiCanonicize
                          ((uint *)p->pFuncs[uVar7],(uint *)local_4038,p->nVars,acStack_4068);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
          Abc_TruthNpnPrint(acStack_4068,uVar3,p->nVars);
          putchar(10);
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)p->nFuncs);
    }
    break;
  case 3:
    if (0 < p->nFuncs) {
      uVar7 = 0;
      do {
        if (fVerbose != 0) {
          printf("%7d : ",uVar7 & 0xffffffff);
        }
        resetPCanonPermArray(acStack_4068,p->nVars);
        uVar3 = luckyCanonicizer_final_fast(p->pFuncs[uVar7],p->nVars,acStack_4068);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
          Abc_TruthNpnPrint(acStack_4068,uVar3,p->nVars);
          putchar(10);
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)p->nFuncs);
    }
    break;
  case 4:
    if (0 < p->nFuncs) {
      uVar7 = 0;
      do {
        if (fVerbose != 0) {
          printf("%7d : ",uVar7 & 0xffffffff);
        }
        resetPCanonPermArray(acStack_4068,p->nVars);
        uVar3 = luckyCanonicizer_final_fast1(p->pFuncs[uVar7],p->nVars,acStack_4068);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
          Abc_TruthNpnPrint(acStack_4068,uVar3,p->nVars);
          putchar(10);
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)p->nFuncs);
    }
    break;
  case 5:
    if (0 < p->nFuncs) {
      uVar7 = 0;
      do {
        if (fVerbose != 0) {
          printf("%7d : ",uVar7 & 0xffffffff);
        }
        uVar3 = Abc_TtCanonicize(p->pFuncs[uVar7],p->nVars,acStack_4068);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
          Abc_TruthNpnPrint(acStack_4068,uVar3,p->nVars);
          putchar(10);
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)p->nFuncs);
    }
    break;
  case 6:
    if (0 < p->nFuncs) {
      uVar7 = 0;
      do {
        if (fVerbose != 0) {
          printf("%7d : ",uVar7 & 0xffffffff);
        }
        uVar3 = Abc_TtCanonicizePhase(p->pFuncs[uVar7],p->nVars);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
          Abc_TruthNpnPrint((char *)0x0,uVar3,p->nVars);
          putchar(10);
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)p->nFuncs);
    }
    break;
  case 7:
    p_00 = Abc_TtHieManStart(p->nVars,5);
    if (0 < p->nFuncs) {
      uVar7 = 0;
      do {
        if (fVerbose == 0) {
          Abc_TtCanonicizeHie(p_00,p->pFuncs[uVar7],p->nVars,acStack_4068,0);
        }
        else {
          printf("%7d : ",uVar7 & 0xffffffff);
          Abc_TtCanonicizeHie(p_00,p->pFuncs[uVar7],p->nVars,acStack_4068,0);
          putchar(10);
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)p->nFuncs);
    }
    goto LAB_002e7ecd;
  case 8:
    p_00 = Abc_TtHieManStart(p->nVars,5);
    if (0 < p->nFuncs) {
      uVar7 = 0;
      do {
        if (fVerbose != 0) {
          printf("%7d : ",uVar7 & 0xffffffff);
        }
        uVar3 = Abc_TtCanonicizeWrap
                          (Abc_TtCanonicizeAda,p_00,p->pFuncs[uVar7],p->nVars,acStack_4068,0x7d);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
          Abc_TruthNpnPrint(acStack_4068,uVar3,p->nVars);
          putchar(10);
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)p->nFuncs);
    }
    goto LAB_002e7ecd;
  default:
    if (2 < NpnType - 9U) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcNpn.c"
                    ,0x167,"void Abc_TruthNpnPerform(Abc_TtStore_t *, int, int)");
    }
    p_00 = Abc_TtHieManStart(p->nVars,5);
    if (0 < p->nFuncs) {
      uVar7 = 0;
      uVar3 = 0;
      do {
        if (fVerbose != 0) {
          printf("%7d : ",uVar7 & 0xffffffff);
        }
        if (NpnType == 0xb) {
          pTruth = p->pFuncs[uVar7];
          iVar2 = p->nVars;
          func = Abc_TtCanonicizeCA;
          flag = 1;
LAB_002e7e7e:
          uVar3 = Abc_TtCanonicizeWrap(func,p_00,pTruth,iVar2,acStack_4068,flag);
        }
        else {
          if (NpnType == 10) {
            pTruth = p->pFuncs[uVar7];
            iVar2 = p->nVars;
            func = Abc_TtCanonicizeAda;
            flag = 0x4af;
            goto LAB_002e7e7e;
          }
          if (NpnType == 9) {
            pTruth = p->pFuncs[uVar7];
            iVar2 = p->nVars;
            func = Abc_TtCanonicizeAda;
            flag = 0x7d;
            goto LAB_002e7e7e;
          }
        }
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
          Abc_TruthNpnPrint(acStack_4068,uVar3,p->nVars);
          putchar(10);
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)p->nFuncs);
    }
LAB_002e7ecd:
    Abc_TtHieManStop(p_00);
  }
LAB_002e7ed2:
  iVar2 = clock_gettime(3,&local_4048);
  if (iVar2 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_4048.tv_nsec / 1000 + local_4048.tv_sec * 1000000;
  }
  lVar5 = lVar5 + local_4050;
  uVar3 = Abc_TruthNpnCountUnique(p);
  iVar2 = 0x9914ba;
  printf("Classes =%9d  ",(ulong)uVar3);
  Abc_Print(iVar2,"%s =","Time");
  Abc_Print(iVar2,"%9.2f sec\n",(double)lVar5 / 1000000.0);
  return;
}

Assistant:

void Abc_TruthNpnPerform( Abc_TtStore_t * p, int NpnType, int fVerbose )
{
    unsigned pAux[2048];
    word pAuxWord[1024], pAuxWord1[1024];
    char pCanonPerm[16];
    unsigned uCanonPhase=0;
    abctime clk = Abc_Clock();
    int i;

    char * pAlgoName = NULL;
    if ( NpnType == 0 )
        pAlgoName = "uniqifying          ";
    else if ( NpnType == 1 )
        pAlgoName = "exact NPN           ";
    else if ( NpnType == 2 )
        pAlgoName = "counting 1s         ";
    else if ( NpnType == 3 )
        pAlgoName = "Jake's hybrid fast  ";
    else if ( NpnType == 4 )
        pAlgoName = "Jake's hybrid good  ";
    else if ( NpnType == 5 )
        pAlgoName = "new hybrid fast     ";
    else if ( NpnType == 6 )
        pAlgoName = "new phase flipping  ";
    else if ( NpnType == 7 )
        pAlgoName = "new hier. matching  ";
    else if ( NpnType == 8 )
        pAlgoName = "new adap. matching  ";
    else if ( NpnType == 9 )
        pAlgoName = "adjustable algorithm (heuristic) ";
    else if ( NpnType == 10 )
        pAlgoName = "adjustable algorithm (exact)     ";
    else if ( NpnType == 11 )
        pAlgoName = "new cost-aware exact algorithm   ";

    assert( p->nVars <= 16 );
    if ( pAlgoName )
        printf( "Applying %-20s to %8d func%s of %2d vars...  ",  
            pAlgoName, p->nFuncs, (p->nFuncs == 1 ? "":"s"), p->nVars );
    if ( fVerbose )
        printf( "\n" );

    if ( NpnType == 0 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), printf( "\n" );
        }
    }
    else if ( NpnType == 1 )
    {
        permInfo* pi; 
        Abc_TruthNpnCountUnique(p);
        pi = setPermInfoPtr(p->nVars);
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            simpleMinimal(p->pFuncs[i], pAuxWord, pAuxWord1, pi, p->nVars);
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
        freePermInfoPtr(pi);
    }
    else if ( NpnType == 2 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = Kit_TruthSemiCanonicize( (unsigned *)p->pFuncs[i], pAux, p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 3 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = luckyCanonicizer_final_fast( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 4 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = luckyCanonicizer_final_fast1( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 5 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicize( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 6 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicizePhase( p->pFuncs[i], p->nVars );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(NULL, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 7 )
    {
        int fExact = 0;
		Abc_TtHieMan_t * pMan = Abc_TtHieManStart( p->nVars, 5 );
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicizeHie( pMan, p->pFuncs[i], p->nVars, pCanonPerm, fExact );
            if ( fVerbose )
//                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(NULL, uCanonPhase, p->nVars), printf( "\n" );
                printf( "\n" );
        }
        // nClasses = Abc_TtManNumClasses( pMan );
		Abc_TtHieManStop( pMan );
    }
    else if ( NpnType == 8 )
    {
//        typedef unsigned(*TtCanonicizeFunc)(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int flag);
        unsigned Abc_TtCanonicizeWrap(TtCanonicizeFunc func, Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int flag);
        unsigned Abc_TtCanonicizeAda(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int iThres);
		
		int fHigh = 1, iEnumThres = 25;
		Abc_TtHieMan_t * pMan = Abc_TtHieManStart(p->nVars, 5);
		for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicizeWrap(Abc_TtCanonicizeAda, pMan, p->pFuncs[i], p->nVars, pCanonPerm, fHigh*100 + iEnumThres);
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
		Abc_TtHieManStop(pMan);
    }
    else if ( NpnType == 9 || NpnType == 10 || NpnType == 11 )
    {
//        typedef unsigned(*TtCanonicizeFunc)(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int flag);
        unsigned Abc_TtCanonicizeWrap(TtCanonicizeFunc func, Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int flag);
        unsigned Abc_TtCanonicizeAda(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int iThres);
        unsigned Abc_TtCanonicizeCA(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int iThres);
		
		Abc_TtHieMan_t * pMan = Abc_TtHieManStart(p->nVars, 5);
		for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            if ( NpnType == 9 )
                uCanonPhase = Abc_TtCanonicizeWrap(Abc_TtCanonicizeAda, pMan, p->pFuncs[i], p->nVars, pCanonPerm,  125); // -A 8, adjustable algorithm (heuristic)
            else if ( NpnType == 10 )
                uCanonPhase = Abc_TtCanonicizeWrap(Abc_TtCanonicizeAda, pMan, p->pFuncs[i], p->nVars, pCanonPerm, 1199); // -A 9, adjustable algorithm (exact)
            else if ( NpnType == 11 )
                uCanonPhase = Abc_TtCanonicizeWrap(Abc_TtCanonicizeCA,  pMan, p->pFuncs[i], p->nVars, pCanonPerm,    1); // -A 10, new cost-aware exact algorithm
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
		Abc_TtHieManStop(pMan);
    }
    else assert( 0 );
    clk = Abc_Clock() - clk;
    printf( "Classes =%9d  ", Abc_TruthNpnCountUnique(p) );
    Abc_PrintTime( 1, "Time", clk );
}